

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O2

int __thiscall ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  int k;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int _w;
  int iVar15;
  long lVar16;
  ulong uVar17;
  void *pvVar18;
  ulong uVar19;
  float fVar20;
  int local_128;
  Mat out;
  Mat top_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m;
  
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  iVar3 = bottom_blob->c;
  iVar6 = this->kernel_h;
  iVar7 = this->dilation_h;
  _w = (this->kernel_w + -1) * this->dilation_w + (uVar1 - 1) * this->stride_w + 1;
  iVar11 = this->stride_h;
  Mat::Mat(&top_blob_bordered,top_blob);
  Mat::create(&top_blob_bordered,_w,(iVar6 + -1) * iVar7 + (uVar2 - 1) * iVar11 + 1,this->num_output
              ,4);
  iVar6 = -100;
  if ((top_blob_bordered.data == (void *)0x0) ||
     ((long)top_blob_bordered.c * top_blob_bordered.cstep == 0)) goto LAB_0010bf69;
  uVar5 = this->kernel_w * this->kernel_h;
  std::vector<int,_std::allocator<int>_>::vector
            (&_space_ofs,(long)(int)uVar5,(allocator_type *)&out);
  iVar6 = this->dilation_h;
  iVar7 = this->kernel_w;
  iVar11 = this->dilation_w * iVar7;
  lVar12 = 0;
  iVar13 = 0;
  for (iVar15 = 0; iVar15 < this->kernel_h; iVar15 = iVar15 + 1) {
    for (lVar16 = 0; (int)lVar16 < iVar7; lVar16 = lVar16 + 1) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)lVar12 + lVar16] = iVar13;
      iVar13 = iVar13 + this->dilation_w;
      iVar7 = this->kernel_w;
    }
    iVar13 = iVar13 + (_w * iVar6 - iVar11);
    lVar12 = (int)lVar12 + lVar16;
  }
  uVar17 = 0;
  uVar19 = 0;
  if (0 < (int)uVar5) {
    uVar19 = (ulong)uVar5;
  }
  iVar6 = 0;
  if (0 < iVar3) {
    iVar6 = iVar3;
  }
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar17;
  }
  uVar9 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar9 = uVar17;
  }
  for (lVar12 = 0; lVar12 < this->num_output; lVar12 = lVar12 + 1) {
    out.data = (void *)(top_blob_bordered.cstep * lVar12 * top_blob_bordered.elemsize +
                       (long)top_blob_bordered.data);
    out.refcount = (int *)0x0;
    out.elemsize = top_blob_bordered.elemsize;
    out.dims = 2;
    out.w = top_blob_bordered.w;
    out.h = top_blob_bordered.h;
    out.c = 1;
    out.cstep = (size_t)(top_blob_bordered.h * top_blob_bordered.w);
    if (this->bias_term == 0) {
      fVar20 = 0.0;
    }
    else {
      fVar20 = *(float *)((long)(this->bias_data).data + lVar12 * 4);
    }
    Mat::fill(&out,fVar20);
    for (iVar7 = 0; local_128 = (int)uVar9, iVar7 != local_128; iVar7 = iVar7 + 1) {
      for (uVar14 = 0; pvVar4 = out.data, uVar14 != uVar8; uVar14 = uVar14 + 1) {
        lVar16 = (long)(int)uVar14 * (long)this->stride_w * 4 +
                 (long)out.w * (long)this->stride_h * (long)iVar7 * 4;
        pvVar18 = (void *)((long)(this->weight_data).data + (long)(int)uVar17 * 4);
        for (iVar11 = 0; iVar11 != iVar6; iVar11 = iVar11 + 1) {
          Mat::channel(&m,bottom_blob,iVar11);
          fVar20 = *(float *)((long)m.data + uVar14 * 4 + (long)m.w * (long)iVar7 * 4);
          for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar4 +
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar10] * 4 + lVar16) =
                 *(float *)((long)pvVar18 + uVar10 * 4) * fVar20 +
                 *(float *)((long)pvVar4 +
                           (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar10] * 4 + lVar16);
          }
          Mat::~Mat(&m);
          pvVar18 = (void *)((long)pvVar18 + (long)(int)uVar5 * 4);
        }
      }
    }
    Mat::~Mat(&out);
    uVar17 = (ulong)((int)uVar17 + iVar3 * uVar5);
  }
  Mat::operator=(top_blob,&top_blob_bordered);
  iVar3 = this->pad_w;
  iVar6 = this->pad_h;
  if (iVar6 < 1 && iVar3 < 1) {
LAB_0010bf5a:
    iVar6 = 0;
  }
  else {
    copy_cut_border(&top_blob_bordered,top_blob,iVar6,iVar6,iVar3,iVar3);
    iVar6 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
    goto LAB_0010bf5a;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
LAB_0010bf69:
  Mat::~Mat(&top_blob_bordered);
  return iVar6;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered = top_blob;
    top_blob_bordered.create(outw, outh, num_output);
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }
    }

    top_blob = top_blob_bordered;

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }

    return 0;
}